

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O1

void luaF_freeproto(lua_State *L,Proto *f)

{
  luaM_free_(L,f->code,(long)f->sizecode << 2);
  luaM_free_(L,f->p,(long)f->sizep << 3);
  luaM_free_(L,f->k,(long)f->sizek << 4);
  luaM_free_(L,f->lineinfo,(long)f->sizelineinfo);
  luaM_free_(L,f->abslineinfo,(long)f->sizeabslineinfo << 3);
  luaM_free_(L,f->locvars,(long)f->sizelocvars << 4);
  luaM_free_(L,f->upvalues,(long)f->sizeupvalues << 4);
  luaM_free_(L,f,0x80);
  return;
}

Assistant:

void luaF_freeproto (lua_State *L, Proto *f) {
  luaM_freearray(L, f->code, f->sizecode);
  luaM_freearray(L, f->p, f->sizep);
  luaM_freearray(L, f->k, f->sizek);
  luaM_freearray(L, f->lineinfo, f->sizelineinfo);
  luaM_freearray(L, f->abslineinfo, f->sizeabslineinfo);
  luaM_freearray(L, f->locvars, f->sizelocvars);
  luaM_freearray(L, f->upvalues, f->sizeupvalues);
  luaM_free(L, f);
}